

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O0

void helper_wrmsr_x86_64(CPUX86State *env)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uintptr_t unaff_retaddr;
  ulong uStack_20;
  uint32_t offset;
  uint64_t update_mask;
  uint64_t val;
  CPUX86State *env_local;
  
  cpu_svm_check_intercept_param_x86_64(env,0x7c,1,unaff_retaddr);
  uVar2 = (uint)env->regs[0];
  uVar3 = (ulong)uVar2 | env->regs[2] << 0x20;
  iVar1 = (int)env->regs[1];
  if (iVar1 == -0x3fffff80) {
    uStack_20 = (ulong)((env->features[6] & 0x800) != 0);
    if ((env->features[6] & 0x20000000) != 0) {
      uStack_20 = uStack_20 | 0x100;
    }
    if ((env->features[6] & 0x2000000) != 0) {
      uStack_20 = uStack_20 | 0x4000;
    }
    if ((env->features[6] & 0x100000) != 0) {
      uStack_20 = uStack_20 | 0x800;
    }
    if ((env->features[7] & 4) != 0) {
      uStack_20 = uStack_20 | 0x1000;
    }
    if ((env->features[6] & 0x2000000) != 0) {
      uStack_20 = uStack_20 | 0x4000;
    }
    cpu_load_efer(env,env->efer & (uStack_20 ^ 0xffffffffffffffff) | uVar2 & uStack_20);
    return;
  }
  if (iVar1 == -0x3fffff7f) {
    env->star = uVar3;
    return;
  }
  if (iVar1 == -0x3fffff7e) {
    env->lstar = uVar3;
    return;
  }
  if (iVar1 == -0x3fffff7d) {
    env->cstar = uVar3;
    return;
  }
  if (iVar1 == -0x3fffff7c) {
    env->fmask = uVar3;
    return;
  }
  if (iVar1 == -0x3fffff00) {
    env->segs[4].base = uVar3;
    return;
  }
  if (iVar1 == -0x3ffffeff) {
    env->segs[5].base = uVar3;
    return;
  }
  if (iVar1 == -0x3ffffefe) {
    env->kernelgsbase = uVar3;
    return;
  }
  if (iVar1 == -0x3ffffefd) {
    env->tsc_aux = uVar3;
    return;
  }
  if (iVar1 == -0x3ffefee9) {
    env->vm_hsave = uVar3;
    return;
  }
  if (iVar1 == 0x1b) {
    return;
  }
  if (iVar1 == 0x174) {
    env->sysenter_cs = uVar2 & 0xffff;
    return;
  }
  if (iVar1 == 0x175) {
    env->sysenter_esp = uVar3;
    return;
  }
  if (iVar1 == 0x176) {
    env->sysenter_eip = uVar3;
    return;
  }
  if (iVar1 == 0x17a) {
    env->mcg_status = uVar3;
    return;
  }
  if (iVar1 == 0x17b) {
    if ((env->mcg_cap & 0x100) == 0) {
      return;
    }
    if ((uVar3 != 0) && (uVar3 != 0xffffffffffffffff)) {
      return;
    }
    env->mcg_ctl = uVar3;
    return;
  }
  if (iVar1 == 0x1a0) {
    env->msr_ia32_misc_enable = uVar3;
    return;
  }
  if (iVar1 == 0x200) {
LAB_00536863:
    env->mtrr_var[(int)env->regs[1] - 0x200U >> 1].base = uVar3;
  }
  else {
    if (iVar1 != 0x201) {
      if (iVar1 == 0x202) goto LAB_00536863;
      if (iVar1 != 0x203) {
        if (iVar1 == 0x204) goto LAB_00536863;
        if (iVar1 != 0x205) {
          if (iVar1 == 0x206) goto LAB_00536863;
          if (iVar1 != 0x207) {
            if (iVar1 == 0x208) goto LAB_00536863;
            if (iVar1 != 0x209) {
              if (iVar1 == 0x20a) goto LAB_00536863;
              if (iVar1 != 0x20b) {
                if (iVar1 == 0x20c) goto LAB_00536863;
                if (iVar1 != 0x20d) {
                  if (iVar1 == 0x20e) goto LAB_00536863;
                  if (iVar1 != 0x20f) {
                    if (iVar1 == 0x250) {
                      env->mtrr_fixed[(int)env->regs[1] - 0x250] = uVar3;
                      return;
                    }
                    if (iVar1 - 600U < 2) {
                      env->mtrr_fixed[(int)env->regs[1] - 599] = uVar3;
                      return;
                    }
                    if (iVar1 - 0x268U < 8) {
                      env->mtrr_fixed[(int)env->regs[1] - 0x265] = uVar3;
                      return;
                    }
                    if (iVar1 == 0x277) {
                      env->pat = uVar3;
                      return;
                    }
                    if (iVar1 == 0x2ff) {
                      env->mtrr_deftype = uVar3;
                      return;
                    }
                    if (iVar1 == 0xd90) {
                      env->msr_bndcfgs = uVar3;
                      cpu_sync_bndcs_hflags_x86_64(env);
                      return;
                    }
                    if ((uint)env->regs[1] < 0x400) {
                      return;
                    }
                    if ((env->mcg_cap & 0x3f) * 4 + 0x400 <= (env->regs[1] & 0xffffffff)) {
                      return;
                    }
                    uVar2 = (int)env->regs[1] - 0x400;
                    if ((((uVar2 & 3) == 0) && (uVar3 != 0)) && (uVar3 != 0xffffffffffffffff)) {
                      return;
                    }
                    env->mce_banks[uVar2] = uVar3;
                    return;
                  }
                }
              }
            }
          }
        }
      }
    }
    env->mtrr_var[(int)env->regs[1] - 0x201U >> 1].mask = uVar3;
  }
  return;
}

Assistant:

void helper_wrmsr(CPUX86State *env)
{
    uint64_t val;

    cpu_svm_check_intercept_param(env, SVM_EXIT_MSR, 1, GETPC());

    val = ((uint32_t)env->regs[R_EAX]) |
        ((uint64_t)((uint32_t)env->regs[R_EDX]) << 32);

    switch ((uint32_t)env->regs[R_ECX]) {
    case MSR_IA32_SYSENTER_CS:
        env->sysenter_cs = val & 0xffff;
        break;
    case MSR_IA32_SYSENTER_ESP:
        env->sysenter_esp = val;
        break;
    case MSR_IA32_SYSENTER_EIP:
        env->sysenter_eip = val;
        break;
    case MSR_IA32_APICBASE:
        // cpu_set_apic_base(env_archcpu(env)->apic_state, val);
        break;
    case MSR_EFER:
        {
            uint64_t update_mask;

            update_mask = 0;
            if (env->features[FEAT_8000_0001_EDX] & CPUID_EXT2_SYSCALL) {
                update_mask |= MSR_EFER_SCE;
            }
            if (env->features[FEAT_8000_0001_EDX] & CPUID_EXT2_LM) {
                update_mask |= MSR_EFER_LME;
            }
            if (env->features[FEAT_8000_0001_EDX] & CPUID_EXT2_FFXSR) {
                update_mask |= MSR_EFER_FFXSR;
            }
            if (env->features[FEAT_8000_0001_EDX] & CPUID_EXT2_NX) {
                update_mask |= MSR_EFER_NXE;
            }
            if (env->features[FEAT_8000_0001_ECX] & CPUID_EXT3_SVM) {
                update_mask |= MSR_EFER_SVME;
            }
            if (env->features[FEAT_8000_0001_EDX] & CPUID_EXT2_FFXSR) {
                update_mask |= MSR_EFER_FFXSR;
            }
            cpu_load_efer(env, (env->efer & ~update_mask) |
                          (val & update_mask));
        }
        break;
    case MSR_STAR:
        env->star = val;
        break;
    case MSR_PAT:
        env->pat = val;
        break;
    case MSR_VM_HSAVE_PA:
        env->vm_hsave = val;
        break;
#ifdef TARGET_X86_64
    case MSR_LSTAR:
        env->lstar = val;
        break;
    case MSR_CSTAR:
        env->cstar = val;
        break;
    case MSR_FMASK:
        env->fmask = val;
        break;
    case MSR_FSBASE:
        env->segs[R_FS].base = val;
        break;
    case MSR_GSBASE:
        env->segs[R_GS].base = val;
        break;
    case MSR_KERNELGSBASE:
        env->kernelgsbase = val;
        break;
#endif
    case MSR_MTRRphysBase(0):
    case MSR_MTRRphysBase(1):
    case MSR_MTRRphysBase(2):
    case MSR_MTRRphysBase(3):
    case MSR_MTRRphysBase(4):
    case MSR_MTRRphysBase(5):
    case MSR_MTRRphysBase(6):
    case MSR_MTRRphysBase(7):
        env->mtrr_var[((uint32_t)env->regs[R_ECX] -
                       MSR_MTRRphysBase(0)) / 2].base = val;
        break;
    case MSR_MTRRphysMask(0):
    case MSR_MTRRphysMask(1):
    case MSR_MTRRphysMask(2):
    case MSR_MTRRphysMask(3):
    case MSR_MTRRphysMask(4):
    case MSR_MTRRphysMask(5):
    case MSR_MTRRphysMask(6):
    case MSR_MTRRphysMask(7):
        env->mtrr_var[((uint32_t)env->regs[R_ECX] -
                       MSR_MTRRphysMask(0)) / 2].mask = val;
        break;
    case MSR_MTRRfix64K_00000:
        env->mtrr_fixed[(uint32_t)env->regs[R_ECX] -
                        MSR_MTRRfix64K_00000] = val;
        break;
    case MSR_MTRRfix16K_80000:
    case MSR_MTRRfix16K_A0000:
        env->mtrr_fixed[(uint32_t)env->regs[R_ECX] -
                        MSR_MTRRfix16K_80000 + 1] = val;
        break;
    case MSR_MTRRfix4K_C0000:
    case MSR_MTRRfix4K_C8000:
    case MSR_MTRRfix4K_D0000:
    case MSR_MTRRfix4K_D8000:
    case MSR_MTRRfix4K_E0000:
    case MSR_MTRRfix4K_E8000:
    case MSR_MTRRfix4K_F0000:
    case MSR_MTRRfix4K_F8000:
        env->mtrr_fixed[(uint32_t)env->regs[R_ECX] -
                        MSR_MTRRfix4K_C0000 + 3] = val;
        break;
    case MSR_MTRRdefType:
        env->mtrr_deftype = val;
        break;
    case MSR_MCG_STATUS:
        env->mcg_status = val;
        break;
    case MSR_MCG_CTL:
        if ((env->mcg_cap & MCG_CTL_P)
            && (val == 0 || val == ~(uint64_t)0)) {
            env->mcg_ctl = val;
        }
        break;
    case MSR_TSC_AUX:
        env->tsc_aux = val;
        break;
    case MSR_IA32_MISC_ENABLE:
        env->msr_ia32_misc_enable = val;
        break;
    case MSR_IA32_BNDCFGS:
        /* FIXME: #GP if reserved bits are set.  */
        /* FIXME: Extend highest implemented bit of linear address.  */
        env->msr_bndcfgs = val;
        cpu_sync_bndcs_hflags(env);
        break;
    default:
        if ((uint32_t)env->regs[R_ECX] >= MSR_MC0_CTL
            && (uint32_t)env->regs[R_ECX] < MSR_MC0_CTL +
            (4 * env->mcg_cap & 0xff)) {
            uint32_t offset = (uint32_t)env->regs[R_ECX] - MSR_MC0_CTL;
            if ((offset & 0x3) != 0
                || (val == 0 || val == ~(uint64_t)0)) {
                env->mce_banks[offset] = val;
            }
            break;
        }
        /* XXX: exception? */
        break;
    }
}